

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

void quantize(JCOEFPTR coef_block,DCTELEM *divisors,DCTELEM *workspace)

{
  short sVar1;
  UDCTELEM2 product;
  int shift;
  UDCTELEM corr;
  UDCTELEM recip;
  JCOEFPTR output_ptr;
  DCTELEM temp;
  int i;
  DCTELEM *workspace_local;
  DCTELEM *divisors_local;
  JCOEFPTR coef_block_local;
  
  for (i = 0; i < 0x40; i = i + 1) {
    sVar1 = workspace[i];
    if (sVar1 < 0) {
      temp = -(short)(((int)-sVar1 + (uint)(ushort)divisors[i + 0x40]) * (uint)(ushort)divisors[i]
                     >> ((char)divisors[i + 0xc0] + 0x10U & 0x1f));
    }
    else {
      temp = (DCTELEM)(((int)sVar1 + (uint)(ushort)divisors[i + 0x40]) * (uint)(ushort)divisors[i]
                      >> ((char)divisors[i + 0xc0] + 0x10U & 0x1f));
    }
    coef_block[i] = temp;
  }
  return;
}

Assistant:

METHODDEF(void)
quantize(JCOEFPTR coef_block, DCTELEM *divisors, DCTELEM *workspace)
{
  int i;
  DCTELEM temp;
  JCOEFPTR output_ptr = coef_block;

#if BITS_IN_JSAMPLE == 8

  UDCTELEM recip, corr;
  int shift;
  UDCTELEM2 product;

  for (i = 0; i < DCTSIZE2; i++) {
    temp = workspace[i];
    recip = divisors[i + DCTSIZE2 * 0];
    corr =  divisors[i + DCTSIZE2 * 1];
    shift = divisors[i + DCTSIZE2 * 3];

    if (temp < 0) {
      temp = -temp;
      product = (UDCTELEM2)(temp + corr) * recip;
      product >>= shift + sizeof(DCTELEM) * 8;
      temp = (DCTELEM)product;
      temp = -temp;
    } else {
      product = (UDCTELEM2)(temp + corr) * recip;
      product >>= shift + sizeof(DCTELEM) * 8;
      temp = (DCTELEM)product;
    }
    output_ptr[i] = (JCOEF)temp;
  }

#else

  register DCTELEM qval;

  for (i = 0; i < DCTSIZE2; i++) {
    qval = divisors[i];
    temp = workspace[i];
    /* Divide the coefficient value by qval, ensuring proper rounding.
     * Since C does not specify the direction of rounding for negative
     * quotients, we have to force the dividend positive for portability.
     *
     * In most files, at least half of the output values will be zero
     * (at default quantization settings, more like three-quarters...)
     * so we should ensure that this case is fast.  On many machines,
     * a comparison is enough cheaper than a divide to make a special test
     * a win.  Since both inputs will be nonnegative, we need only test
     * for a < b to discover whether a/b is 0.
     * If your machine's division is fast enough, define FAST_DIVIDE.
     */
#ifdef FAST_DIVIDE
#define DIVIDE_BY(a, b)  a /= b
#else
#define DIVIDE_BY(a, b)  if (a >= b) a /= b;  else a = 0
#endif
    if (temp < 0) {
      temp = -temp;
      temp += qval >> 1;        /* for rounding */
      DIVIDE_BY(temp, qval);
      temp = -temp;
    } else {
      temp += qval >> 1;        /* for rounding */
      DIVIDE_BY(temp, qval);
    }
    output_ptr[i] = (JCOEF)temp;
  }

#endif

}